

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyplayer.cpp
# Opt level: O0

uchar * check_and_convert(uchar *tune,uint *length)

{
  int local_a94;
  uchar *puStack_a90;
  int converted_length;
  uint8_t *converted;
  undefined1 local_a80 [4];
  int version;
  ssbase base;
  uint *length_local;
  uchar *tune_local;
  
  base._2648_8_ = length;
  sdInit();
  if ((tune[2] == '\0') && (tune[3] == '\0')) {
    converted._4_4_ = CheckV2MVersion(tune,*(int *)base._2648_8_,(ssbase *)local_a80);
    if (converted._4_4_ < 0) {
      SDL_LogCritical(7,"Failed to Check Version on input file");
      tune_local = (uchar *)0x0;
    }
    else {
      ConvertV2M(tune,*(int *)base._2648_8_,&stack0xfffffffffffff570,&local_a94);
      *(int *)base._2648_8_ = local_a94;
      free(tune);
      tune_local = puStack_a90;
    }
  }
  else {
    SDL_LogCritical(7,"No valid input file");
    tune_local = (uchar *)0x0;
  }
  return tune_local;
}

Assistant:

static unsigned char* check_and_convert(unsigned char* tune, unsigned int* length)
{
    sdInit();

    if (tune[2] != 0 || tune[3] != 0)
    {
        SDL_LogCritical(SDL_LOG_CATEGORY_INPUT, "No valid input file");
        return NULL;
    }
    ssbase base;
    int version = CheckV2MVersion(tune, *length, base);
    if (version < 0)
    {
        SDL_LogCritical(SDL_LOG_CATEGORY_INPUT, "Failed to Check Version on input file");
        return NULL;
    }

    uint8_t* converted;
    int converted_length;
    ConvertV2M(tune, *length, &converted, &converted_length);
    *length = converted_length;
    free(tune);

    return converted;
}